

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall cmGeneratorTarget::AddSourceCommon(cmGeneratorTarget *this,string *src,bool before)

{
  long *plVar1;
  const_iterator __position;
  pointer pcVar2;
  TargetPropertyEntryVector *pTVar3;
  undefined7 in_register_00000011;
  undefined1 local_90 [8];
  long *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  element_type *peStack_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  long *local_58;
  size_type local_50;
  long local_48;
  element_type *peStack_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  
  pTVar3 = (TargetPropertyEntryVector *)
           &(this->SourceEntries).
            super__Vector_base<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((int)CONCAT71(in_register_00000011,before) != 0) {
    pTVar3 = &this->SourceEntries;
  }
  __position._M_current =
       (pTVar3->
       super__Vector_base<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  plVar1 = (long *)(local_80._M_local_buf + 8);
  pcVar2 = (src->_M_dataplus)._M_p;
  local_88 = plVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar2,pcVar2 + src->_M_string_length);
  cmMakefile::GetBacktrace(this->Makefile);
  if (local_88 == plVar1) {
    peStack_40 = peStack_70;
    local_58 = &local_48;
  }
  else {
    local_58 = local_88;
  }
  local_48 = CONCAT71(local_80._9_7_,local_80._M_local_buf[8]);
  local_50 = local_80._M_allocated_capacity;
  local_80._M_allocated_capacity = 0;
  local_80._M_local_buf[8] = '\0';
  local_38 = local_68._M_pi;
  p_Stack_30 = p_Stack_60;
  local_68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88 = plVar1;
  CreateTargetPropertyEntry
            ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )local_90,SUB81(&local_58,0));
  std::
  vector<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
  ::_M_insert_rval(&this->SourceEntries,__position,(value_type *)local_90);
  if (local_90 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_90 + 8))();
  }
  local_90 = (undefined1  [8])0x0;
  if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
  }
  if (local_88 != plVar1) {
    operator_delete(local_88,CONCAT71(local_80._9_7_,local_80._M_local_buf[8]) + 1);
  }
  ClearSourcesCache(this);
  return;
}

Assistant:

void cmGeneratorTarget::AddSourceCommon(const std::string& src, bool before)
{
  this->SourceEntries.insert(
    before ? this->SourceEntries.begin() : this->SourceEntries.end(),
    CreateTargetPropertyEntry(
      BT<std::string>(src, this->Makefile->GetBacktrace()), true));
  this->ClearSourcesCache();
}